

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O1

void __thiscall Vault::JwtStrategy::~JwtStrategy(JwtStrategy *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_AuthenticationStrategy)._vptr_AuthenticationStrategy =
       (_func_int **)&PTR__JwtStrategy_001c4518;
  pcVar2 = (this->mount_).value_._M_dataplus._M_p;
  paVar1 = &(this->mount_).value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (*(undefined1 **)&this->jwt_ != &this->field_0x38) {
    operator_delete(*(undefined1 **)&this->jwt_,*(long *)&this->field_0x38 + 1);
  }
  pcVar2 = (this->role_).value_._M_dataplus._M_p;
  paVar1 = &(this->role_).value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x68);
  return;
}

Assistant:

JwtStrategy(RoleId role, Jwt jwt)
    : role_(std::move(role))
    , jwt_(std::move(jwt))
    , mount_(Path{"jwt"})
  {}